

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_add_cfile
                  (mz_zip_archive *pZip,char *pArchive_name,FILE *pSrc_file,mz_uint64 size_to_add,
                  time_t *pFile_time,void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  bool bVar2;
  uint uVar3;
  mz_bool mVar4;
  mz_uint mVar5;
  mz_uint32 mVar6;
  tdefl_status tVar7;
  mz_uint64 *pmVar8;
  size_t sVar9;
  mz_uint8 *pmVar10;
  tdefl_compressor *d;
  size_t sVar11;
  mz_ulong mVar12;
  mz_uint64 mVar13;
  undefined1 uVar14;
  tdefl_flush flush;
  mz_uint64 *pLocal_header_ofs;
  mz_uint64 *pmVar15;
  mz_uint64 *pmVar16;
  int iVar17;
  mz_uint8 *pExtra;
  size_t sVar18;
  int iVar19;
  ulong uVar20;
  mz_uint64 mVar21;
  mz_uint8 *pmVar22;
  size_t sStackY_190;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  int local_124;
  mz_uint8 *local_120;
  undefined8 local_118;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  mz_zip_error local_fc;
  undefined8 local_f8;
  size_t local_f0;
  char *local_e8;
  uint local_dc;
  mz_uint8 *local_d8;
  ulong local_d0;
  mz_zip_writer_add_state state;
  size_t local_a8;
  mz_uint64 local_dir_header_ofs;
  undefined1 local_98 [5];
  undefined2 uStack_93;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  long lStack_82;
  FILE *local_70;
  ulong local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  local_f8 = pZip->m_archive_size;
  comp_size = 0;
  uVar3 = 6;
  if (-1 < (int)level_and_flags) {
    uVar3 = level_and_flags;
  }
  pmVar1 = pZip->m_pState;
  if ((((pmVar1 == (mz_zip_internal_state *)0x0) || (pArchive_name == (char *)0x0)) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (pComment == (void *)0x0 && comment_size != 0 || 10 < (uVar3 & 0xf))) {
LAB_0010b05e:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  iVar17 = pmVar1->m_zip64;
  if (size_to_add >> 0x20 != 0 && iVar17 == 0) {
    pmVar1->m_zip64 = 1;
    iVar17 = 1;
  }
  if ((uVar3 >> 10 & 1) != 0) goto LAB_0010b05e;
  local_118 = CONCAT44(local_118._4_4_,uVar3) & 0xffffffff0000000f;
  uncomp_size = size_to_add;
  local_e8 = pArchive_name;
  local_70 = (FILE *)pSrc_file;
  local_60 = pComment;
  mVar4 = mz_zip_writer_validate_archive_name(pArchive_name);
  if (mVar4 == 0) {
LAB_0010b0a6:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  if (iVar17 == 0) {
    bVar2 = true;
    if (pZip->m_total_files == 0xffff) {
      pmVar1->m_zip64 = 1;
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    if (pZip->m_total_files == 0xffffffff) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  local_f0 = strlen(local_e8);
  if (0xffff < local_f0) goto LAB_0010b0a6;
  mVar5 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  sVar9 = (pmVar1->m_central_dir).m_size;
  local_68 = (ulong)comment_size;
  if (0xfffffffe < local_f0 + local_68 + sVar9 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  local_d0 = (ulong)mVar5;
  local_120 = (mz_uint8 *)(ulong)user_extra_data_len;
  if ((bVar2) &&
     ((ulong)(local_120 +
             sVar9 + local_d0 + local_f0 * 2 + user_extra_data_central_len + local_f8 + local_68 +
             0x472) >> 0x20 != 0)) {
    pmVar1->m_zip64 = 1;
  }
  if (pFile_time != (time_t *)0x0) {
    mz_zip_time_t_to_dos_time(*pFile_time,&dos_time,&dos_date);
    size_to_add = uncomp_size;
  }
  mVar21 = local_f8;
  mVar4 = (int)local_118;
  if (size_to_add < 4) {
    mVar4 = 0;
  }
  local_118 = CONCAT44(local_118._4_4_,mVar4);
  mVar4 = mz_zip_writer_write_zeros(pZip,local_f8,mVar5);
  sVar18 = local_f0;
  if (mVar4 == 0) {
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  uVar20 = mVar21 + local_d0;
  local_dir_header_ofs = uVar20;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar20) != 0)) {
    __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/knicked[P]CCraft/deps/miniz/miniz.c"
                  ,0x1900,
                  "mz_bool mz_zip_writer_add_cfile(mz_zip_archive *, const char *, FILE *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  iVar19 = (uint)((int)local_118 != 0) << 3;
  uStack_88 = 0;
  lStack_82 = 0;
  _local_98 = 0;
  uStack_90 = 0;
  uStack_8f = 0;
  uStack_8e = 0;
  uStack_8d = 0;
  uStack_8c = 0;
  uStack_8b = 0;
  uStack_8a = 0;
  iVar17 = (uint)((level_and_flags >> 0x10 & 1) == 0) << 0xb;
  local_f8 = CONCAT44(local_f8._4_4_,iVar17) | 8;
  if (pmVar1->m_zip64 == 0) {
    if (uVar20 >> 0x20 != 0 || comp_size._4_4_ != 0) goto LAB_0010b2b3;
    uVar14 = 0x14;
    if ((int)local_118 == 0) {
      uVar14 = 0;
    }
    local_98 = (undefined1  [5])CONCAT14(uVar14,0x4034b50);
    _local_98 = CONCAT16(8,CONCAT15(0,local_98));
    _local_98 = CONCAT17((char)((uint)iVar17 >> 8),_local_98);
    uStack_8e = (undefined1)dos_time;
    local_d0 = CONCAT44(local_d0._4_4_,(uint)dos_time);
    uStack_8d = (undefined1)(dos_time >> 8);
    local_dc = (uint)dos_date;
    uStack_8c = (undefined1)dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    lStack_82 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,(short)local_f0)) << 0x20;
    uStack_90 = (char)iVar19;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar20,local_98,0x1e);
    if (sVar9 != 0x1e) goto LAB_0010b4f9;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar20 + 0x1e,local_e8,sVar18);
    if (sVar9 != sVar18) goto LAB_0010b4f9;
    pmVar22 = (mz_uint8 *)(uVar20 + 0x1e + sVar18);
    pExtra = (mz_uint8 *)0x0;
    local_a8 = 0;
  }
  else {
    if (uVar20 < 0xffffffff && size_to_add < 0xffffffff) {
      local_d8 = (mz_uint8 *)0x0;
      local_a8 = 0;
    }
    else {
      pmVar8 = (mz_uint64 *)0x0;
      pmVar15 = &uncomp_size;
      if (size_to_add < 0xffffffff) {
        pmVar15 = pmVar8;
      }
      pmVar16 = &comp_size;
      if (size_to_add < 0xffffffff) {
        pmVar16 = pmVar8;
      }
      pLocal_header_ofs = &local_dir_header_ofs;
      if (uVar20 < 0xffffffff) {
        pLocal_header_ofs = pmVar8;
      }
      local_d8 = extra_data;
      mVar6 = mz_zip_writer_create_zip64_extra_data(local_d8,pmVar15,pmVar16,pLocal_header_ofs);
      local_a8 = (size_t)mVar6;
    }
    sVar18 = local_f0;
    iVar17 = (int)local_a8 + user_extra_data_len;
    uVar14 = 0x14;
    if ((int)local_118 == 0) {
      uVar14 = 0;
    }
    local_98 = (undefined1  [5])CONCAT14(uVar14,0x4034b50);
    _local_98 = CONCAT25(0x800,local_98);
    _local_98 = CONCAT17((char)(local_f8 >> 8),_local_98);
    uStack_8f = 0;
    uStack_8e = (undefined1)dos_time;
    local_d0 = CONCAT44(local_d0._4_4_,(uint)dos_time);
    uStack_8d = (undefined1)(dos_time >> 8);
    local_dc = (uint)dos_date;
    uStack_8c = (undefined1)dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    lStack_82 = (ulong)CONCAT13((char)((uint)iVar17 >> 8),CONCAT12((char)iVar17,(short)local_f0)) <<
                0x20;
    uStack_90 = (char)iVar19;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar20,local_98,0x1e);
    if (sVar9 != 0x1e) goto LAB_0010b4f9;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar20 + 0x1e,local_e8,sVar18);
    if (sVar9 != sVar18) goto LAB_0010b4f9;
    mVar21 = uVar20 + 0x1e + sVar18;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar21,extra_data,local_a8);
    if (sVar9 != local_a8) goto LAB_0010b4f9;
    pmVar22 = (mz_uint8 *)(mVar21 + local_a8);
    pExtra = local_d8;
  }
  if (user_extra_data_len != 0) {
    pmVar10 = (mz_uint8 *)
              (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)pmVar22,user_extra_data,
                                (size_t)local_120);
    if (pmVar10 != local_120) {
LAB_0010b4f9:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    pmVar22 = pmVar22 + (long)local_120;
  }
  mVar21 = uncomp_size;
  local_fc = MZ_ZIP_FILE_READ_FAILED;
  if (uncomp_size == 0) {
    mVar12 = 0;
  }
  else {
    pmVar10 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
    if (pmVar10 == (mz_uint8 *)0x0) {
LAB_0010b6da:
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    local_124 = iVar19;
    local_120 = pmVar10;
    local_d8 = pExtra;
    if ((int)local_118 == 0) {
      mVar12 = 0;
      for (; mVar13 = uncomp_size, mVar21 != 0; mVar21 = mVar21 - sVar18) {
        sVar18 = 0x10000;
        if (mVar21 < 0x10000) {
          sVar18 = mVar21;
        }
        sVar11 = fread(pmVar10,1,sVar18,local_70);
        if ((sVar11 != sVar18) ||
           (sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)pmVar22,pmVar10,sVar18),
           sVar9 != sVar18)) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar10);
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
          return 0;
        }
        mVar12 = mz_crc32(mVar12 & 0xffffffff,pmVar10,sVar18);
        pmVar22 = pmVar22 + sVar18;
      }
    }
    else {
      d = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
      if (d == (tdefl_compressor *)0x0) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_120);
        goto LAB_0010b6da;
      }
      state.m_comp_size = 0;
      mVar12 = 0;
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = (mz_uint64)pmVar22;
      mVar5 = tdefl_create_comp_flags_from_zip_params((int)local_118,-0xf,0);
      tdefl_init(d,mz_zip_writer_add_put_buf_callback,&state,mVar5);
      pmVar22 = local_120;
      do {
        sVar18 = 0x10000;
        if (mVar21 < 0x10000) {
          sVar18 = mVar21;
        }
        sVar11 = fread(pmVar22,1,sVar18,local_70);
        if (sVar11 != sVar18) goto LAB_0010b6fa;
        mVar12 = mz_crc32(mVar12 & 0xffffffff,pmVar22,sVar18);
        if (pZip->m_pNeeds_keepalive == (mz_file_needs_keepalive)0x0) {
          flush = TDEFL_NO_FLUSH;
        }
        else {
          mVar4 = (*pZip->m_pNeeds_keepalive)(pZip->m_pIO_opaque);
          flush = (uint)(mVar4 != 0) * 3;
        }
        pmVar22 = local_120;
        mVar21 = mVar21 - sVar18;
        if (mVar21 == 0) {
          flush = TDEFL_FINISH;
        }
        tVar7 = tdefl_compress_buffer(d,local_120,sVar18,flush);
      } while (tVar7 == TDEFL_STATUS_OKAY);
      if (tVar7 == TDEFL_STATUS_DONE) {
        bVar2 = false;
      }
      else {
        local_fc = MZ_ZIP_COMPRESSION_FAILED;
LAB_0010b6fa:
        pZip->m_last_error = local_fc;
        bVar2 = true;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,d);
      mVar13 = state.m_comp_size;
      pmVar22 = (mz_uint8 *)state.m_cur_archive_file_ofs;
      if (bVar2) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_120);
        return 0;
      }
    }
    comp_size = mVar13;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_120);
    pExtra = local_d8;
    iVar19 = local_124;
  }
  mVar21 = state.m_cur_archive_file_ofs;
  state.m_pZip = (mz_zip_archive *)
                 CONCAT17((char)(mVar12 >> 0x18),
                          CONCAT16((char)(mVar12 >> 0x10),
                                   CONCAT15((char)(mVar12 >> 8),CONCAT14((char)mVar12,0x8074b50))));
  uVar14 = (undefined1)(uncomp_size >> 0x18);
  if (pExtra == (mz_uint8 *)0x0) {
    if (comp_size >> 0x20 != 0) {
LAB_0010b2b3:
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    pmVar15 = &state.m_cur_archive_file_ofs;
    state.m_cur_archive_file_ofs._7_1_ = SUB81(mVar21,7);
    state.m_cur_archive_file_ofs._0_7_ =
         CONCAT16((char)(uncomp_size >> 0x10),
                  CONCAT15((char)(uncomp_size >> 8),CONCAT14((char)uncomp_size,(int)comp_size)));
    sStackY_190 = 0x10;
  }
  else {
    pmVar15 = &state.m_comp_size;
    state.m_cur_archive_file_ofs = comp_size;
    state.m_comp_size._0_7_ = (undefined7)uncomp_size;
    uVar14 = (undefined1)(uncomp_size >> 0x38);
    sStackY_190 = 0x18;
  }
  *(undefined1 *)((long)pmVar15 + 7) = uVar14;
  local_124 = iVar19;
  local_118 = mVar12;
  sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)pmVar22,&state,sStackY_190);
  if (sVar9 != sStackY_190) {
    return 0;
  }
  if (pExtra != (mz_uint8 *)0x0) {
    pmVar15 = (mz_uint64 *)0x0;
    pmVar8 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar8 = pmVar15;
    }
    pmVar16 = &comp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar16 = pmVar15;
    }
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar15 = &local_dir_header_ofs;
    }
    mVar6 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar8,pmVar16,pmVar15);
    local_a8._0_2_ = (mz_uint16)mVar6;
  }
  mVar4 = mz_zip_writer_add_to_central_dir
                    (pZip,local_e8,(mz_uint16)local_f0,pExtra,(mz_uint16)local_a8,local_60,
                     (mz_uint16)local_68,uncomp_size,comp_size,(mz_uint32)local_118,
                     (mz_uint16)local_124,(mz_uint16)local_f8,(mz_uint16)local_d0,
                     (mz_uint16)local_dc,local_dir_header_ofs,0,user_extra_data_central,
                     user_extra_data_central_len);
  if (mVar4 != 0) {
    pZip->m_total_files = pZip->m_total_files + 1;
    pZip->m_archive_size = (mz_uint64)(pmVar22 + sStackY_190);
    return 1;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_cfile(mz_zip_archive *pZip, const char *pArchive_name, MZ_FILE *pSrc_file, mz_uint64 size_to_add, const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size, mz_uint level_and_flags,
                                const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 gen_flags = MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;
    mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
    mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
    mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = size_to_add, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_zip_internal_state *pState;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;
    level = level_and_flags & 0xF;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if ((!pState->m_zip64) && (uncomp_size > MZ_UINT32_MAX))
    {
        /* Source file is too large for non-zip64 */
        /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        pState->m_zip64 = MZ_TRUE;
    }

    /* We could support this, but why? */
    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
    }

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE 
			+ archive_name_size + comment_size + user_extra_data_len + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

#ifndef MINIZ_NO_TIME
    if (pFile_time)
    {
        mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
    }
#endif

    if (uncomp_size <= 3)
        level = 0;

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += num_alignment_padding_bytes;
    local_dir_header_ofs = cur_archive_file_ofs;

    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    if (uncomp_size && level)
    {
        method = MZ_DEFLATED;
    }

    MZ_CLEAR_OBJ(local_dir_header);
    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, extra_size + user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += extra_size;
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (uncomp_size)
    {
        mz_uint64 uncomp_remaining = uncomp_size;
        void *pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
        if (!pRead_buf)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!level)
        {
            while (uncomp_remaining)
            {
                mz_uint n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
                if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) || (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf, n) != n))
                {
                    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                }
                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
                uncomp_remaining -= n;
                cur_archive_file_ofs += n;
            }
            comp_size = uncomp_size;
        }
        else
        {
            mz_bool result = MZ_FALSE;
            mz_zip_writer_add_state state;
            tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
            if (!pComp)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            state.m_pZip = pZip;
            state.m_cur_archive_file_ofs = cur_archive_file_ofs;
            state.m_comp_size = 0;

            if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
            }

            for (;;)
            {
                size_t in_buf_size = (mz_uint32)MZ_MIN(uncomp_remaining, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
                tdefl_status status;
                tdefl_flush flush = TDEFL_NO_FLUSH;

                if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    break;
                }

                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
                uncomp_remaining -= in_buf_size;

                if (pZip->m_pNeeds_keepalive != NULL && pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
                    flush = TDEFL_FULL_FLUSH;

                status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size, uncomp_remaining ? flush : TDEFL_FINISH);
                if (status == TDEFL_STATUS_DONE)
                {
                    result = MZ_TRUE;
                    break;
                }
                else if (status != TDEFL_STATUS_OKAY)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
                    break;
                }
            }

            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

            if (!result)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return MZ_FALSE;
            }

            comp_size = state.m_comp_size;
            cur_archive_file_ofs = state.m_cur_archive_file_ofs;
        }

        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
    }

    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, extra_size, pComment, comment_size,
                                          uncomp_size, comp_size, uncomp_crc32, method, gen_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}